

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManMonitor.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::DataManMonitor::AddCompression
          (DataManMonitor *this,string *method,string *accuracyUsed)

{
  float fVar1;
  
  std::__cxx11::string::_M_assign((string *)&this->m_CompressionMethod);
  if (accuracyUsed->_M_string_length != 0) {
    fVar1 = std::__cxx11::stof(accuracyUsed,(size_t *)0x0);
    this->m_CompressionAccuracy = fVar1;
  }
  return;
}

Assistant:

void DataManMonitor::AddCompression(const std::string &method, const std::string &accuracyUsed)
{
    m_CompressionMethod = method;

    if (!accuracyUsed.empty())
    {
        m_CompressionAccuracy = std::stof(accuracyUsed);
    }
}